

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Resupply_Received_PDU.cpp
# Opt level: O2

void __thiscall
KDIS::PDU::Resupply_Received_PDU::Resupply_Received_PDU
          (Resupply_Received_PDU *this,EntityIdentifier *ReceivingEntity,
          EntityIdentifier *SupplyingEntity)

{
  Logistics_Header::Logistics_Header(&this->super_Logistics_Header,ReceivingEntity,SupplyingEntity);
  (this->super_Logistics_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Resupply_Received_PDU_0021d510;
  this->m_ui8NumSupplyTypes = '\0';
  this->m_ui16Padding1 = 0;
  this->m_ui8Padding2 = '\0';
  (this->m_vSupplies).
  super__Vector_base<KDIS::DATA_TYPE::Supplies,_std::allocator<KDIS::DATA_TYPE::Supplies>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_vSupplies).
  super__Vector_base<KDIS::DATA_TYPE::Supplies,_std::allocator<KDIS::DATA_TYPE::Supplies>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vSupplies).
  super__Vector_base<KDIS::DATA_TYPE::Supplies,_std::allocator<KDIS::DATA_TYPE::Supplies>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_Logistics_Header).super_Header.super_Header6.m_ui8PDUType = '\a';
  (this->super_Logistics_Header).super_Header.super_Header6.m_ui16PDULength = 0x1c;
  return;
}

Assistant:

Resupply_Received_PDU::Resupply_Received_PDU( const EntityIdentifier & ReceivingEntity, const EntityIdentifier & SupplyingEntity )  :
    Logistics_Header( ReceivingEntity, SupplyingEntity ),
    m_ui16Padding1( 0 ),
    m_ui8Padding2( 0 ),
    m_ui8NumSupplyTypes( 0 )
{
    m_ui8PDUType = Resupply_Received_PDU_Type;
    m_ui16PDULength = RESUPPLY_RECEIVED_PDU_SIZE;
}